

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O2

ssize_t validator_mq_receive(mqd_t validator_mq,validator_mq_msg *msg,_Bool *err)

{
  long lVar1;
  size_t __msg_len;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ssize_t sStack_40;
  char acStack_38 [8];
  
  sStack_40 = 0x101de8;
  __msg_len = validator_mq_get_buffsize(validator_mq,err);
  if (*err == true) {
    *err = true;
    sStack_40 = 0x101e0e;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                  ,"validator_mq_receive");
    sVar2 = -1;
  }
  else {
    lVar1 = -(__msg_len + 0xf & 0xfffffffffffffff0);
    pcVar3 = acStack_38 + lVar1 + -8;
    builtin_strncpy(acStack_38 + lVar1 + -8,";\x1e\x10",4);
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    sVar2 = mq_receive(validator_mq,acStack_38 + lVar1,__msg_len,(uint *)0x0);
    if (sVar2 < 1) {
      *err = true;
      pcVar5 = acStack_38 + lVar1 + -8;
      builtin_strncpy(acStack_38 + lVar1 + -8,"u\x1e\x10",4);
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                    ,"validator_mq_receive");
      pcVar6 = acStack_38 + lVar1 + -8;
      pcVar6[0] = -1;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      pcVar6[4] = -1;
      pcVar6[5] = -1;
      pcVar6[6] = -1;
      pcVar6[7] = -1;
      sVar2 = *(ssize_t *)(acStack_38 + lVar1 + -8);
    }
    else {
      pcVar4 = acStack_38 + lVar1 + -8;
      builtin_strncpy(acStack_38 + lVar1 + -8,"S\x1e\x10",4);
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      memcpy(msg,acStack_38 + lVar1,0x3f8);
    }
  }
  return sVar2;
}

Assistant:

ssize_t validator_mq_receive(mqd_t validator_mq, validator_mq_msg *msg, bool *err) {
    assert(msg != NULL && err != NULL);

    size_t buffsize = validator_mq_get_buffsize(validator_mq, err);
    INT_FAIL_IF(*err);

    char buff[buffsize];
    ssize_t request_ret = mq_receive(validator_mq, buff, buffsize, NULL);
    INT_FAIL_IF(request_ret <= 0);

    memcpy(msg, buff, sizeof(validator_mq_msg));
    return request_ret;
}